

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.hpp
# Opt level: O2

int __thiscall
utils::sigslot<void_(int)>::connect
          (sigslot<void_(int)> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  pthread_mutex_t *__mutex;
  undefined4 in_register_00000034;
  shared_ptr<utils::detail::slot<void_(int)>_> s;
  undefined1 local_30 [16];
  
  __mutex = (pthread_mutex_t *)
            ((list<std::shared_ptr<utils::detail::slot<void_(int)>_>,_std::allocator<std::shared_ptr<utils::detail::slot<void_(int)>_>_>_>
              *)CONCAT44(in_register_00000034,__fd) + 1);
  std::mutex::lock((mutex *)&__mutex->__data);
  std::make_shared<utils::detail::slot<void(int)>,utils::detail::slot<void(int)>const&>
            ((slot<void_(int)> *)local_30);
  std::__cxx11::
  list<std::shared_ptr<utils::detail::slot<void_(int)>_>,_std::allocator<std::shared_ptr<utils::detail::slot<void_(int)>_>_>_>
  ::push_back((list<std::shared_ptr<utils::detail::slot<void_(int)>_>,_std::allocator<std::shared_ptr<utils::detail::slot<void_(int)>_>_>_>
               *)CONCAT44(in_register_00000034,__fd),(value_type *)local_30);
  std::__weak_ptr<utils::detail::slot<void(int)>,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<utils::detail::slot<void(int)>,void>
            ((__weak_ptr<utils::detail::slot<void(int)>,(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<utils::detail::slot<void_(int)>,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_30 + 8));
  pthread_mutex_unlock(__mutex);
  return (int)this;
}

Assistant:

SlotID connect(SlotType const &slot)
    {
        std::lock_guard<std::mutex> guard(m_mutex);
        auto const s = std::make_shared<SlotType>(slot);
        m_slots.push_back(s);
        return s;
    }